

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * __thiscall roaring::Roaring64Map::operator-=(Roaring64Map *this,Roaring64Map *other)

{
  uint uVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  Roaring64Map *in_RSI;
  iterator in_RDI;
  Roaring *other_bitmap;
  Roaring *self_bitmap;
  uint other_key;
  uint self_key;
  const_iterator other_iter;
  iterator self_iter;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20 [3];
  Roaring64Map *local_8;
  
  if ((Roaring64Map *)in_RDI._M_node == in_RSI) {
    std::
    map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::clear((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             *)0x116fac);
    local_8 = (Roaring64Map *)in_RDI._M_node;
  }
  else {
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::begin(in_stack_ffffffffffffff78);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::cbegin(in_stack_ffffffffffffff78);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::end(in_stack_ffffffffffffff78);
      bVar2 = std::operator!=(local_20,&local_30);
      uVar5 = false;
      if (bVar2) {
        local_38._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             ::cend(in_stack_ffffffffffffff78);
        uVar5 = std::operator!=(&local_28,&local_38);
      }
      local_8 = (Roaring64Map *)in_RDI._M_node;
      if ((bool)uVar5 == false) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                          0x117042);
      uVar1 = ppVar3->first;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                           *)0x117052);
      if (uVar1 < ppVar4->first) {
        local_20[0]._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             ::lower_bound(in_stack_ffffffffffffff78,(key_type *)0x117071);
      }
      else if (ppVar4->first < uVar1) {
        local_28._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             ::lower_bound(in_stack_ffffffffffffff78,(key_type *)0x11709e);
      }
      else {
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x1170bc);
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   0x1170cf);
        Roaring::operator-=((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffff80),
                            (Roaring *)in_stack_ffffffffffffff78);
        bVar2 = Roaring::isEmpty((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
        if (bVar2) {
          local_20[0]._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
               ::erase_abi_cxx11_((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                                   *)CONCAT17(uVar5,in_stack_ffffffffffffff80),in_RDI);
        }
        else {
          std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                    ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                     CONCAT17(uVar5,in_stack_ffffffffffffff80));
        }
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   CONCAT17(uVar5,in_stack_ffffffffffffff80));
      }
    }
  }
  return local_8;
}

Assistant:

Roaring64Map &operator-=(const Roaring64Map &other) {
        if (this == &other) {
            // Subtracting *this from itself results in the empty map.
            roarings.clear();
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self - other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  empty           None
        // present  absent   unchanged       None
        // present  present  empty or not    Subtract other from self, but
        //                                   erase self if result is empty
        //
        // Because there is only work to do when a key is present in both 'self'
        // and 'other', the main while loop ping-pongs back and forth until it
        // finds the next key that is the same on both sides.

        auto self_iter = roarings.begin();
        auto other_iter = other.roarings.cbegin();

        while (self_iter != roarings.end() &&
               other_iter != other.roarings.cend()) {
            auto self_key = self_iter->first;
            auto other_key = other_iter->first;
            if (self_key < other_key) {
                // Because self_key is < other_key, advance self_iter to the
                // first point where self_key >= other_key (or end).
                self_iter = roarings.lower_bound(other_key);
                continue;
            }

            if (self_key > other_key) {
                // Because self_key is > other_key, advance other_iter to the
                // first point where other_key >= self_key (or end).
                other_iter = other.roarings.lower_bound(self_key);
                continue;
            }

            // Both sides have self_key. In the logic table above, this reflects
            // the case (self.present & other.present). So subtract other from
            // self.
            auto &self_bitmap = self_iter->second;
            const auto &other_bitmap = other_iter->second;
            self_bitmap -= other_bitmap;

            if (self_bitmap.isEmpty()) {
                // ...but if subtraction is empty, remove it altogether.
                self_iter = roarings.erase(self_iter);
            } else {
                ++self_iter;
            }
            ++other_iter;
        }
        return *this;
    }